

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_zero_output(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  aec_stream_conflict *in_RDI;
  internal_state_conflict *state;
  
  piVar1 = in_RDI->state;
  do {
    if (in_RDI->avail_out < (ulong)piVar1->bytes_per_sample) {
      return 0;
    }
    put_sample(in_RDI,0);
    uVar2 = piVar1->sample_counter - 1;
    piVar1->sample_counter = uVar2;
  } while (uVar2 != 0);
  piVar1->mode = m_next_cds;
  return 1;
}

Assistant:

static int m_zero_output(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        put_sample(strm, 0);
    } while(--state->sample_counter);

    state->mode = m_next_cds;
    return M_CONTINUE;
}